

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_menubar_end(nk_context *ctx)

{
  long lVar1;
  long lVar2;
  nk_rect r;
  long in_RDI;
  nk_command_buffer *out;
  nk_panel *layout;
  nk_window *win;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) {
    lVar1 = *(long *)(in_RDI + 0x40d8);
    lVar2 = *(long *)(lVar1 + 0xa8);
    if (((*(uint *)(lVar2 + 4) & 0x2000) == 0) && ((*(uint *)(lVar2 + 4) & 0x8000) == 0)) {
      *(float *)(lVar2 + 0x60) = *(float *)(lVar2 + 0x2c) - *(float *)(lVar2 + 0x58);
      *(float *)(lVar2 + 0x60) =
           *(float *)(lVar2 + 0x60) + *(float *)(lVar2 + 0x78) + *(float *)(in_RDI + 0x1e90);
      *(float *)(lVar2 + 0xc) = *(float *)(lVar2 + 0xc) + *(float *)(lVar2 + 0x60);
      *(float *)(lVar2 + 0x14) = *(float *)(lVar2 + 0x14) - *(float *)(lVar2 + 0x60);
      **(undefined4 **)(lVar2 + 0x18) = *(undefined4 *)(lVar2 + 100);
      **(undefined4 **)(lVar2 + 0x20) = *(undefined4 *)(lVar2 + 0x68);
      *(float *)(lVar2 + 0x2c) = *(float *)(lVar2 + 0xc) - *(float *)(lVar2 + 0x78);
      *(undefined4 *)(lVar2 + 0x48) = *(undefined4 *)(lVar2 + 0xc);
      *(undefined4 *)(lVar2 + 0x50) = *(undefined4 *)(lVar2 + 0x14);
      r.w = (float)(int)lVar1;
      r.h = (float)(int)((ulong)lVar1 >> 0x20);
      r.x = (float)(int)lVar2;
      r.y = (float)(int)((ulong)lVar2 >> 0x20);
      nk_push_scissor((nk_command_buffer *)(lVar1 + 0x68),r);
    }
  }
  return;
}

Assistant:

NK_API void
nk_menubar_end(struct nk_context *ctx)
{
struct nk_window *win;
struct nk_panel *layout;
struct nk_command_buffer *out;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
out = &win->buffer;
layout = win->layout;
if (layout->flags & NK_WINDOW_HIDDEN || layout->flags & NK_WINDOW_MINIMIZED)
return;

layout->menu.h  = layout->at_y - layout->menu.y;
layout->menu.h += layout->row.height + ctx->style.window.spacing.y;

layout->bounds.y += layout->menu.h;
layout->bounds.h -= layout->menu.h;

*layout->offset_x = layout->menu.offset.x;
*layout->offset_y = layout->menu.offset.y;
layout->at_y      = layout->bounds.y - layout->row.height;

layout->clip.y = layout->bounds.y;
layout->clip.h = layout->bounds.h;
nk_push_scissor(out, layout->clip);
}